

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_io.c
# Opt level: O2

int arkGetLastStep(void *arkode_mem,realtype *hlast)

{
  int iVar1;
  
  if (arkode_mem == (void *)0x0) {
    iVar1 = -0x15;
    arkProcessError((ARKodeMem)0x0,-0x15,"ARKode","arkGetLastStep","arkode_mem = NULL illegal.");
  }
  else {
    *hlast = *(realtype *)((long)arkode_mem + 0x238);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int arkGetLastStep(void *arkode_mem, realtype *hlast)
{
  ARKodeMem ark_mem;
  if (arkode_mem==NULL) {
    arkProcessError(NULL, ARK_MEM_NULL, "ARKode",
                    "arkGetLastStep", MSG_ARK_NO_MEM);
    return(ARK_MEM_NULL);
  }
  ark_mem = (ARKodeMem) arkode_mem;

  *hlast = ark_mem->hold;
  return(ARK_SUCCESS);
}